

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram.cpp
# Opt level: O2

void duckdb::
     HistogramFunction<duckdb::DefaultMapType<std::unordered_map<signed_char,unsigned_long,std::hash<signed_char>,std::equal_to<signed_char>,std::allocator<std::pair<signed_char_const,unsigned_long>>>>>
     ::
     Combine<duckdb::HistogramAggState<signed_char,std::unordered_map<signed_char,unsigned_long,std::hash<signed_char>,std::equal_to<signed_char>,std::allocator<std::pair<signed_char_const,unsigned_long>>>>,duckdb::HistogramFunction<duckdb::DefaultMapType<std::unordered_map<signed_char,unsigned_long,std::hash<signed_char>,std::equal_to<signed_char>,std::allocator<std::pair<signed_char_const,unsigned_long>>>>>>
               (HistogramAggState<signed_char,_std::unordered_map<signed_char,_unsigned_long,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<std::pair<const_signed_char,_unsigned_long>_>_>_>
                *source,HistogramAggState<signed_char,_std::unordered_map<signed_char,_unsigned_long,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<std::pair<const_signed_char,_unsigned_long>_>_>_>
                        *target,AggregateInputData *input_data)

{
  _Hash_node_base *p_Var1;
  unordered_map<signed_char,_unsigned_long,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<std::pair<const_signed_char,_unsigned_long>_>_>
  *puVar2;
  mapped_type *pmVar3;
  __node_base *p_Var4;
  
  puVar2 = source->hist;
  if (puVar2 != (unordered_map<signed_char,_unsigned_long,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<std::pair<const_signed_char,_unsigned_long>_>_>
                 *)0x0) {
    if (target->hist ==
        (unordered_map<signed_char,_unsigned_long,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<std::pair<const_signed_char,_unsigned_long>_>_>
         *)0x0) {
      puVar2 = DefaultMapType<std::unordered_map<signed_char,_unsigned_long,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<std::pair<const_signed_char,_unsigned_long>_>_>_>
               ::CreateEmpty(input_data->allocator);
      target->hist = puVar2;
      puVar2 = source->hist;
    }
    p_Var4 = &(puVar2->_M_h)._M_before_begin;
    while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
      p_Var1 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var4 + 2))->_M_max_load_factor;
      pmVar3 = ::std::__detail::
               _Map_base<signed_char,_std::pair<const_signed_char,_unsigned_long>,_std::allocator<std::pair<const_signed_char,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<signed_char>,_std::hash<signed_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<signed_char,_std::pair<const_signed_char,_unsigned_long>,_std::allocator<std::pair<const_signed_char,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<signed_char>,_std::hash<signed_char>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)target->hist,(key_type *)(p_Var4 + 1));
      *pmVar3 = (long)&p_Var1->_M_nxt + *pmVar3;
    }
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &input_data) {
		if (!source.hist) {
			return;
		}
		if (!target.hist) {
			target.hist = MAP_TYPE::CreateEmpty(input_data.allocator);
		}
		for (auto &entry : *source.hist) {
			(*target.hist)[entry.first] += entry.second;
		}
	}